

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareEdgeDistance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  D *b;
  D *b_00;
  BasicVector<Vector3,_long_double,_3UL> *this;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble n2;
  longdouble n1;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  Vector3<long_double> n;
  Vector3<long_double> a0_dir;
  Vector3<long_double> m;
  Vector3<long_double> a1_dir;
  Vector3<long_double> local_f8;
  FloatType local_c8;
  longdouble local_b8;
  longdouble local_a8;
  longdouble local_98;
  longdouble local_88;
  longdouble local_78;
  FloatType local_68 [3];
  
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)a0,a1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((BasicVector<Vector3,_long_double,_3UL> *)a0,a1);
  local_f8.c_[0]._0_10_ = local_88 * local_a8 - local_78 * local_b8;
  local_f8.c_[1]._0_10_ = local_78 * local_c8._0_10_ - local_a8 * local_98;
  local_f8.c_[2]._0_10_ = local_b8 * local_98 - local_c8._0_10_ * local_88;
  this = (BasicVector<Vector3,_long_double,_3UL> *)&local_98;
  lVar4 = in_ST0;
  n2 = in_ST0;
  n1 = in_ST0;
  lVar6 = in_ST0;
  lVar7 = in_ST0;
  Vector3<long_double>::CrossProd(&local_f8,x);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)a0,x);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)a1,x);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)&local_c8,this,b);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)local_68,this,b_00);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((BasicVector<Vector3,_long_double,_3UL> *)&local_f8);
  sqrtl();
  lVar5 = (n1 * (longdouble)8.118802153517006 + (longdouble)6.153480596427404e-15) *
          (longdouble)5.421011e-20;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm(&local_c8,this);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm(local_68,this);
  if ((ABS(in_ST0) < lVar5 * lVar6) || (ABS(lVar4) < lVar5 * lVar7)) {
    iVar1 = TriageCompareDistance<long_double>(x,a0,r2);
    iVar2 = TriageCompareDistance<long_double>(x,a1,r2);
    if (iVar2 < iVar1) {
      iVar1 = iVar2;
    }
    iVar3 = TriageCompareLineDistance<long_double>(x,a0,a1,r2,&local_f8,n1,n2);
    iVar2 = 0;
    if (iVar1 == iVar3) {
      iVar2 = iVar3;
    }
  }
  else if (in_ST0 < (longdouble)0 && (longdouble)0 < lVar4) {
    iVar2 = TriageCompareLineDistance<long_double>(x,a0,a1,r2,&local_f8,n1,n2);
  }
  else {
    iVar2 = TriageCompareDistance<long_double>(x,a0,r2);
    iVar1 = TriageCompareDistance<long_double>(x,a1,r2);
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int TriageCompareEdgeDistance(const Vector3<T>& x, const Vector3<T>& a0,
                              const Vector3<T>& a1, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // First we need to decide whether the closest point is an edge endpoint or
  // somewhere in the interior.  To determine this we compute a plane
  // perpendicular to (a0, a1) that passes through X.  Letting M be the normal
  // to this plane, the closest point is in the edge interior if and only if
  // a0.M < 0 and a1.M > 0.  Note that we can use "<" rather than "<=" because
  // if a0.M or a1.M is zero exactly then it doesn't matter which code path we
  // follow (since the distance to an endpoint and the distance to the edge
  // interior are exactly the same in this case).
  Vector3<T> n = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> m = n.CrossProd(x);
  // For better accuracy when the edge (a0,a1) is very short, we subtract "x"
  // before computing the dot products with M.
  Vector3<T> a0_dir = a0 - x;
  Vector3<T> a1_dir = a1 - x;
  T a0_sign = a0_dir.DotProd(m);
  T a1_sign = a1_dir.DotProd(m);
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  T n1_error = ((3.5 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T a0_sign_error = n1_error * a0_dir.Norm();
  T a1_sign_error = n1_error * a1_dir.Norm();
  if (fabs(a0_sign) < a0_sign_error || fabs(a1_sign) < a1_sign_error) {
    // It is uncertain whether minimum distance is to an edge vertex or to the
    // edge interior.  We handle this by computing both distances and checking
    // whether they yield the same result.
    int vertex_sign = min(TriageCompareDistance(x, a0, r2),
                          TriageCompareDistance(x, a1, r2));
    int line_sign = TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
    return (vertex_sign == line_sign) ? line_sign : 0;
  }
  if (a0_sign >= 0 || a1_sign <= 0) {
    // The minimum distance is to an edge endpoint.
    return min(TriageCompareDistance(x, a0, r2),
               TriageCompareDistance(x, a1, r2));
  } else {
    // The minimum distance is to the edge interior.
    return TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
  }
}